

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLhandler.c
# Opt level: O0

void RDL_giveVertices(uint a,uint b,char *array,RDL_sPathInfo *spi,char *visited)

{
  uint b_00;
  uint local_2c;
  uint vertex;
  uint i;
  char *visited_local;
  RDL_sPathInfo *spi_local;
  char *array_local;
  uint b_local;
  uint a_local;
  
  visited[b] = '\x01';
  if (a == b) {
    array[a] = '\x01';
  }
  else {
    array[b] = '\x01';
    for (local_2c = 0; local_2c < spi->dPaths[a]->degree[b]; local_2c = local_2c + 1) {
      b_00 = spi->dPaths[a]->adjList[b][local_2c][0];
      if (visited[b_00] == '\0') {
        RDL_giveVertices(a,b_00,array,spi,visited);
      }
    }
  }
  return;
}

Assistant:

void RDL_giveVertices(unsigned a, unsigned b, char *array,
    const RDL_sPathInfo *spi, char *visited)
{
 /* similar to the function "List_Paths" from Vismara*/
  unsigned i, vertex;

  visited[b] = 1;

  if(a==b)
  {
    array[a] = 1;
    return;
  }
  array[b] = 1;
  /*for each vertex adjacent to b in U_a*/
  for(i=0; i<spi->dPaths[a]->degree[b]; ++i)
  {
    vertex = spi->dPaths[a]->adjList[b][i][0];
    if (!visited[vertex]) {
      RDL_giveVertices(a, vertex, array, spi, visited);
    }
  }
}